

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Suffix_Array.cpp
# Opt level: O0

void __thiscall CaPS_SA::Suffix_Array<unsigned_long>::clean_up(Suffix_Array<unsigned_long> *this)

{
  ostream *poVar1;
  anon_class_1_0_00000001 *in_RDI;
  rep_conflict rVar2;
  time_point t_e;
  time_point t_s;
  nanoseconds *in_stack_ffffffffffffffc8;
  
  std::chrono::_V2::system_clock::now();
  deallocate<unsigned_long>((unsigned_long *)0x10ff3e);
  deallocate<unsigned_long>((unsigned_long *)0x10ff4c);
  deallocate<unsigned_long>((unsigned_long *)0x10ff5a);
  deallocate<unsigned_long>((unsigned_long *)0x10ff68);
  deallocate<unsigned_long>((unsigned_long *)0x10ff76);
  std::chrono::_V2::system_clock::now();
  poVar1 = std::operator<<((ostream *)&std::cerr,
                           "Released the temporary data structures. Time taken: ");
  std::chrono::operator-
            ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)poVar1,
             (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)in_RDI);
  rVar2 = anon_class_1_0_00000001::operator()(in_RDI,in_stack_ffffffffffffffc8);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar2);
  std::operator<<(poVar1," seconds.\n");
  return;
}

Assistant:

void Suffix_Array<T_idx_>::clean_up()
{
    const auto t_s = now();

    deallocate(SA_w), deallocate(LCP_w);

    deallocate(pivot_);
    deallocate(part_size_scan_);
    deallocate(part_ruler_);

    const auto t_e = now();
    std::cerr << "Released the temporary data structures. Time taken: " << duration(t_e - t_s) << " seconds.\n";
}